

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::ChainPromiseNode::tracePromise
          (ChainPromiseNode *this,TraceBuilder *builder,bool stopAtNextEvent)

{
  PromiseNode *pPVar1;
  bool stopAtNextEvent_local;
  TraceBuilder *builder_local;
  ChainPromiseNode *this_local;
  
  if ((!stopAtNextEvent) || (this->state != STEP1)) {
    pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&this->inner);
    (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])
              (pPVar1,builder,(ulong)stopAtNextEvent);
  }
  return;
}

Assistant:

void ChainPromiseNode::tracePromise(TraceBuilder& builder, bool stopAtNextEvent) {
  if (stopAtNextEvent && state == STEP1) {
    // In STEP1, we are an Event -- when the inner node resolves, it will arm *this* object.
    // In STEP2, we are not an Event -- when the inner node resolves, it directly arms our parent
    // event.
    return;
  }

  inner->tracePromise(builder, stopAtNextEvent);
}